

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSymbol.cpp
# Opt level: O1

Var Js::JavascriptSymbol::TryInvokeRemotelyOrThrow
              (JavascriptMethod entryPoint,ScriptContext *scriptContext,Arguments *args,
              int32 errorCode,PCWSTR varName)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  Var pvVar5;
  undefined4 *puVar6;
  RecyclableObject *pRVar7;
  Type TVar8;
  Type local_68;
  Type local_60;
  Var local_58;
  Var result;
  JavascriptMethod local_48;
  PCWSTR local_40;
  int32 local_34;
  
  result = scriptContext;
  local_48 = entryPoint;
  pvVar5 = Arguments::operator[](args,0);
  if (pvVar5 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_00d331d2;
    *puVar6 = 0;
  }
  local_40 = varName;
  local_34 = errorCode;
  if (((ulong)pvVar5 & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)pvVar5 & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00d331d2;
    *puVar6 = 0;
  }
  TVar8 = TypeIds_FirstNumberType;
  if ((((ulong)pvVar5 & 0xffff000000000000) != 0x1000000000000) &&
     (TVar8 = TypeIds_Number, (ulong)pvVar5 >> 0x32 == 0)) {
    pRVar7 = UnsafeVarTo<Js::RecyclableObject>(pvVar5);
    if (pRVar7 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00d331d2;
      *puVar6 = 0;
    }
    TVar8 = ((pRVar7->type).ptr)->typeId;
    if ((0x57 < (int)TVar8) && (BVar3 = RecyclableObject::IsExternal(pRVar7), BVar3 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar2) {
LAB_00d331d2:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
    }
  }
  if (TVar8 == TypeIds_HostDispatch) {
    pvVar5 = Arguments::operator[](args,0);
    pRVar7 = VarTo<Js::RecyclableObject>(pvVar5);
    local_68 = args->Info;
    local_60 = args->Values;
    iVar4 = (*(pRVar7->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x55])(pRVar7,local_48,&local_68,&local_58);
    if (iVar4 != 0) {
      return local_58;
    }
  }
  pvVar5 = result;
  bVar2 = ThreadContext::RecordImplicitException(*(ThreadContext **)((long)result + 0x3b8));
  if (!bVar2) {
    return *(Var *)(*(long *)((long)pvVar5 + 8) + 0x430);
  }
  JavascriptError::ThrowTypeError((ScriptContext *)pvVar5,local_34,local_40);
}

Assistant:

Var JavascriptSymbol::TryInvokeRemotelyOrThrow(JavascriptMethod entryPoint, ScriptContext * scriptContext, Arguments & args, int32 errorCode, PCWSTR varName)
    {
        if (JavascriptOperators::GetTypeId(args[0]) == TypeIds_HostDispatch)
        {
            Var result;
            if (VarTo<RecyclableObject>(args[0])->InvokeBuiltInOperationRemotely(entryPoint, args, &result))
            {
                return result;
            }
        }
        // Don't error if we disabled implicit calls
        if (scriptContext->GetThreadContext()->RecordImplicitException())
        {
            JavascriptError::ThrowTypeError(scriptContext, errorCode, varName);
        }
        else
        {
            return scriptContext->GetLibrary()->GetUndefined();
        }
    }